

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

Mat3x3d * __thiscall OpenMD::Thermo::getPressureTensor(Thermo *this,Snapshot *snap)

{
  long in_RDX;
  Vector3<double> *in_RSI;
  Mat3x3d *in_RDI;
  Mat3x3d virialTensor;
  RealType volume;
  StuntDouble *sd;
  Molecule *mol;
  iterator j;
  MoleculeIterator i;
  Vector3d vcom;
  RealType mass;
  Mat3x3d p_tens;
  Mat3x3d pressureTensor;
  Snapshot *in_stack_fffffffffffffc98;
  Snapshot *in_stack_fffffffffffffca0;
  SimInfo *in_stack_fffffffffffffca8;
  iterator *in_stack_fffffffffffffcb8;
  SimInfo *in_stack_fffffffffffffcc0;
  RectMatrix<double,_3U,_3U> *m1;
  RectMatrix<double,_3U,_3U> local_310;
  RectMatrix<double,_3U,_3U> local_2c8;
  RectMatrix<double,_3U,_3U> local_280 [3];
  Snapshot *local_1a8;
  RectMatrix<double,_3U,_3U> local_158;
  SimInfo *local_f8;
  Snapshot *local_f0;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_e8;
  RectMatrix<double,_3U,_3U> local_e0 [3];
  
  if ((*(byte *)(in_RDX + 0xa86) & 1) == 0) {
    SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x16fc7b);
    SquareMatrix3<double>::SquareMatrix3
              ((SquareMatrix3<double> *)in_stack_fffffffffffffca0,(double)in_stack_fffffffffffffc98)
    ;
    Vector3<double>::Vector3((Vector3<double> *)0x16fc9a);
    m1 = local_e0;
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator
              ((_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> *)m1);
    __gnu_cxx::
    __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
    ::__normal_iterator(&local_e8);
    local_f0 = (Snapshot *)
               SimInfo::beginMolecule
                         (in_stack_fffffffffffffcc0,(MoleculeIterator *)in_stack_fffffffffffffcb8);
    while (local_f0 != (Snapshot *)0x0) {
      in_stack_fffffffffffffcc0 =
           (SimInfo *)
           Molecule::beginIntegrableObject
                     ((Molecule *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
      local_f8 = in_stack_fffffffffffffcc0;
      while (local_f8 != (SimInfo *)0x0) {
        in_stack_fffffffffffffcb8 = (iterator *)StuntDouble::getMass((StuntDouble *)local_f8);
        local_e0[0].data_[1][1] = (double)in_stack_fffffffffffffcb8;
        StuntDouble::getVel((StuntDouble *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffca0,
                   (Vector3<double> *)in_stack_fffffffffffffc98);
        outProduct<double>(in_RSI,(Vector3<double> *)in_RDI);
        OpenMD::operator*((double)m1,(RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffcc0);
        RectMatrix<double,_3U,_3U>::operator+=
                  ((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffca0,
                   (RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffc98);
        RectMatrix<double,_3U,_3U>::~RectMatrix(&local_158);
        SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x16fdf9);
        in_stack_fffffffffffffca8 =
             (SimInfo *)
             Molecule::nextIntegrableObject
                       ((Molecule *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
        local_f8 = in_stack_fffffffffffffca8;
      }
      in_stack_fffffffffffffca0 =
           (Snapshot *)
           SimInfo::nextMolecule
                     (in_stack_fffffffffffffcc0,(MoleculeIterator *)in_stack_fffffffffffffcb8);
      local_f0 = in_stack_fffffffffffffca0;
    }
    in_stack_fffffffffffffc98 = (Snapshot *)getVolume((Thermo *)in_stack_fffffffffffffca0);
    local_1a8 = in_stack_fffffffffffffc98;
    Snapshot::getVirialTensor(in_stack_fffffffffffffc98);
    OpenMD::operator*((double)m1,(RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffcc0);
    OpenMD::operator+(m1,(RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffcc0);
    operator/(m1,(double)in_stack_fffffffffffffcc0);
    SquareMatrix<double,_3>::SquareMatrix
              ((SquareMatrix<double,_3> *)in_stack_fffffffffffffca0,
               (RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffc98);
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)in_stack_fffffffffffffca8,
               (SquareMatrix<double,_3> *)in_stack_fffffffffffffca0);
    SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x16ff9b);
    RectMatrix<double,_3U,_3U>::~RectMatrix(local_280);
    RectMatrix<double,_3U,_3U>::~RectMatrix(&local_2c8);
    RectMatrix<double,_3U,_3U>::~RectMatrix(&local_310);
    Snapshot::setPressureTensor(in_stack_fffffffffffffca0,(Mat3x3d *)in_stack_fffffffffffffc98);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x16ffe3);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x16fff0);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x16fffd);
  }
  Snapshot::getPressureTensor(in_stack_fffffffffffffc98);
  return in_RDI;
}

Assistant:

Mat3x3d Thermo::getPressureTensor(Snapshot* snap) {
    // returns pressure tensor in units amu*fs^-2*Ang^-1
    // routine derived via viral theorem description in:
    // Paci, E. and Marchi, M. J.Phys.Chem. 1996, 100, 4314-4322
    if (!snap->hasPressureTensor) {
      Mat3x3d pressureTensor;
      Mat3x3d p_tens(0.0);
      RealType mass;
      Vector3d vcom;

      SimInfo::MoleculeIterator i;
      vector<StuntDouble*>::iterator j;
      Molecule* mol;
      StuntDouble* sd;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          mass = sd->getMass();
          vcom = sd->getVel(snap);
          p_tens += mass * outProduct(vcom, vcom);
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, p_tens.getArrayPointer(), 9, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
#endif

      RealType volume      = this->getVolume();
      Mat3x3d virialTensor = snap->getVirialTensor();

      pressureTensor =
          (p_tens + Constants::energyConvert * virialTensor) / volume;

      snap->setPressureTensor(pressureTensor);
    }
    return snap->getPressureTensor();
  }